

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::unset_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  unsigned_long *puVar3;
  TypedID<(spirv_cross::Types)0> local_44;
  Decoration *local_40;
  Decoration *dec;
  TypedID<(spirv_cross::Types)0> local_2c;
  size_t local_28;
  TypedID<(spirv_cross::Types)0> local_20;
  ExtendedDecorations local_1c;
  uint32_t local_18;
  ExtendedDecorations decoration_local;
  uint32_t index_local;
  uint32_t type_local;
  Compiler *this_local;
  
  local_1c = decoration;
  local_18 = index;
  decoration_local = type;
  _index_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_20,type);
  pmVar1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->ir).meta,&local_20);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,decoration_local);
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->ir).meta,&local_2c);
  local_28 = VectorView<spirv_cross::Meta::Decoration>::size
                       (&(pmVar2->members).super_VectorView<spirv_cross::Meta::Decoration>);
  dec = (Decoration *)((ulong)local_18 + 1);
  puVar3 = ::std::max<unsigned_long>(&local_28,(unsigned_long *)&dec);
  SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(&pmVar1->members,*puVar3);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_44,decoration_local);
  pmVar1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->ir).meta,&local_44);
  local_40 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                       (&(pmVar1->members).super_VectorView<spirv_cross::Meta::Decoration>,
                        (ulong)local_18);
  Bitset::clear(&(local_40->extended).flags,local_1c);
  (local_40->extended).values[local_1c] = 0;
  return;
}

Assistant:

void Compiler::unset_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration)
{
	ir.meta[type].members.resize(max(ir.meta[type].members.size(), size_t(index) + 1));
	auto &dec = ir.meta[type].members[index];
	dec.extended.flags.clear(decoration);
	dec.extended.values[decoration] = 0;
}